

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

void __thiscall xla::GraphCycles::RemoveNode(GraphCycles *this,int32_t node)

{
  pointer pNVar1;
  pointer pNVar2;
  int *piVar3;
  pointer piVar4;
  Rep *pRVar5;
  iterator __position;
  int *piVar6;
  vector<int,_std::allocator<int>_> *__range1;
  int32_t local_2c;
  
  pNVar2 = (this->rep_->node_io_).
           super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar1 = pNVar2 + node;
  piVar3 = *(pointer *)
            ((long)&pNVar2[node].out.value_sequence_.super__Vector_base<int,_std::allocator<int>_> +
            8);
  local_2c = node;
  for (piVar6 = *(int **)&pNVar2[node].out.value_sequence_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl; piVar6 != piVar3;
      piVar6 = piVar6 + 1) {
    OrderedSet<int>::Erase
              (&(this->rep_->node_io_).
                super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                ._M_impl.super__Vector_impl_data._M_start[*piVar6].in,node);
  }
  piVar3 = *(pointer *)
            ((long)&(pNVar1->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8);
  for (piVar6 = *(int **)&(pNVar1->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>
      ; piVar6 != piVar3; piVar6 = piVar6 + 1) {
    OrderedSet<int>::Erase
              (&(this->rep_->node_io_).
                super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                ._M_impl.super__Vector_impl_data._M_start[*piVar6].out,node);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(pNVar1->in).value_to_index_._M_h);
  piVar4 = *(pointer *)&(pNVar1->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>;
  if (*(pointer *)
       ((long)&(pNVar1->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8) !=
      piVar4) {
    *(pointer *)
     ((long)&(pNVar1->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8) =
         piVar4;
  }
  std::
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(pNVar1->out).value_to_index_._M_h);
  piVar4 = *(pointer *)
            &(pNVar1->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl;
  if (*(pointer *)
       ((long)&(pNVar1->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8) !=
      piVar4) {
    *(pointer *)
     ((long)&(pNVar1->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8) =
         piVar4;
  }
  pRVar5 = this->rep_;
  __position._M_current =
       (pRVar5->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pRVar5->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&pRVar5->free_nodes_,__position,&local_2c);
  }
  else {
    *__position._M_current = node;
    (pRVar5->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void GraphCycles::RemoveNode(int32_t node) {
  NodeIO* x = &rep_->node_io_[node];
  for (int32_t y : x->out.GetSequence()) {
    rep_->node_io_[y].in.Erase(node);
  }
  for (int32_t y : x->in.GetSequence()) {
    rep_->node_io_[y].out.Erase(node);
  }
  x->in.Clear();
  x->out.Clear();
  rep_->free_nodes_.push_back(node);
}